

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_state_check.h
# Opt level: O2

void __thiscall libaom_test::RegisterStateCheckMMX::Check(RegisterStateCheckMMX *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  SEARCH_METHODS *pSVar2;
  undefined8 in_FPUInstructionPointer;
  AssertHelper local_48;
  AssertionResult gtest_ar_1;
  AssertHelper local_30;
  uint16_t post_fpu_env [14];
  
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0xff;
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)post_fpu_env,"0xffff","pre_fpu_env_[4]",(int *)&gtest_ar_1,
             this->pre_fpu_env_ + 4);
  if ((char)post_fpu_env[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    std::operator<<((ostream *)(CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 0x10),
                    "FPU was in an inconsistent state prior to call");
    puVar1 = (undefined8 *)CONCAT44(post_fpu_env._12_4_,CONCAT22(post_fpu_env[5],post_fpu_env[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/register_state_check.h"
               ,0x6a,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(post_fpu_env + 4));
  post_fpu_env._12_4_ = (undefined4)in_FPUInstructionPointer;
  post_fpu_env[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  local_48.data_._0_4_ = 0xffff;
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)&gtest_ar_1,"0xffff","post_fpu_env[4]",(int *)&local_48,post_fpu_env + 4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    std::operator<<((ostream *)(CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) + 0x10),
                    "FPU was left in an inconsistent state after call");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/register_state_check.h"
               ,0x6f,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

void Check() const {
    EXPECT_EQ(0xffff, pre_fpu_env_[4])
        << "FPU was in an inconsistent state prior to call";

    uint16_t post_fpu_env[14];
    __asm__ volatile("fstenv %0" : "=rm"(post_fpu_env));
    EXPECT_EQ(0xffff, post_fpu_env[4])
        << "FPU was left in an inconsistent state after call";
  }